

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.h
# Opt level: O2

void __thiscall CharContent::CharContent(CharContent *this,char *cc)

{
  size_t __n;
  char *pcVar1;
  size_t __n_00;
  
  this->_vptr_CharContent = (_func_int **)&PTR__CharContent_00117c18;
  this->npos = 0xffffffffffffffff;
  __n = strlen(cc);
  if (__n != 0) {
    this->m_length = __n * 2;
    pcVar1 = (char *)operator_new__(__n * 2);
    this->m = pcVar1;
    this->size = __n;
    __n_00 = 0;
    if (0 < (long)__n) {
      __n_00 = __n;
    }
    memset(pcVar1 + __n,0,__n_00);
    memcpy(pcVar1,cc,__n);
    return;
  }
  pcVar1 = (char *)operator_new__(10);
  this->m = pcVar1;
  this->size = 0;
  this->m_length = 10;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  return;
}

Assistant:

CharContent(const char *cc){
        size_t n=strlen(cc);
        if(n==0){
            m=new char [10];
            size=0;
            m_length=10;
            memset(m,'\0',m_length);
            return;
        }else{
            m_length=2*n;
            m=new char [m_length];
            size=n;
            memset(m,'\0',m_length);
            memmove(m,cc,n);
			return;
        }
    }